

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O0

void __thiscall
slang::ast::ModportPortSymbol::serializeTo(ModportPortSymbol *this,ASTSerializer *serializer)

{
  ASTSerializer *pAVar1;
  basic_string_view<char,_std::char_traits<char>_> local_58;
  string_view local_48;
  string_view local_38;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  ASTSerializer *local_18;
  ASTSerializer *serializer_local;
  ModportPortSymbol *this_local;
  
  local_18 = serializer;
  serializer_local = (ASTSerializer *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_28,"direction");
  local_38 = ast::toString(this->direction);
  ASTSerializer::write(serializer,(int)local_28._M_len,local_28._M_str,local_38._M_len);
  pAVar1 = local_18;
  if (this->internalSymbol != (Symbol *)0x0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_48,"internalSymbol");
    ASTSerializer::writeLink(pAVar1,local_48,this->internalSymbol);
  }
  pAVar1 = local_18;
  if (this->explicitConnection != (Expression *)0x0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_58,"explicitConnection");
    ASTSerializer::write
              (pAVar1,(int)local_58._M_len,local_58._M_str,(size_t)this->explicitConnection);
  }
  return;
}

Assistant:

void ModportPortSymbol::serializeTo(ASTSerializer& serializer) const {
    serializer.write("direction", toString(direction));
    if (internalSymbol)
        serializer.writeLink("internalSymbol", *internalSymbol);
    if (explicitConnection)
        serializer.write("explicitConnection", *explicitConnection);
}